

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O1

QVariant * __thiscall
QGenericItemModel::data
          (QVariant *__return_storage_ptr__,QGenericItemModel *this,QModelIndex *index,int role)

{
  long in_FS_OFFSET;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = role;
  QGenericItemModelImplBase::callConst<QVariant,QModelIndex,int>
            (__return_storage_ptr__,*(QGenericItemModelImplBase **)(this + 0x10),Data,index,
             &local_14);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericItemModel::data(const QModelIndex &index, int role) const
{
    return impl->callConst<QVariant>(QGenericItemModelImplBase::Data, index, role);
}